

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

void proc_ctu32(H265eSlice *slice,DataCu *cu)

{
  RK_U8 RVar1;
  uint uVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  uint uVar5;
  RK_S32 cuDepth;
  RK_U32 numPartions;
  RK_U32 bpely;
  RK_U32 tpely;
  RK_U32 rpelx;
  RK_U32 lpelx;
  RK_U32 m_nCtuSize;
  RK_U32 cu_y_1;
  RK_U32 cu_x_1;
  RK_U32 m;
  RK_U32 k;
  H265eSps *sps;
  DataCu *cu_local;
  H265eSlice *slice_local;
  
  uVar2 = slice->m_sps->m_maxCUSize;
  RVar3 = cu->pixelX;
  RVar4 = cu->pixelY;
  uVar5 = 1 << ((byte)(slice->m_sps->m_maxCUDepth << 1) & 0x1f);
  for (cu_x_1 = 0; cu_x_1 < uVar5; cu_x_1 = cu_x_1 + 1) {
    cu->m_cuDepth[cu_x_1] = '\0';
    cu->m_cuSize[cu_x_1] = (RK_U8)uVar2;
  }
  if ((cu->tile_end_x < (RVar3 + uVar2) - 1) || (cu->tile_end_y < (RVar4 + uVar2) - 1)) {
    for (cu_y_1 = 0; cu_y_1 < 4; cu_y_1 = cu_y_1 + 1) {
      proc_cu16(cu,(cu_y_1 & 1) * (uVar2 >> 1),(cu_y_1 >> 1) * (uVar2 >> 1),uVar5 >> 2,1,cu_y_1);
    }
    for (cu_x_1 = 0; cu_x_1 < uVar5; cu_x_1 = cu_x_1 + 1) {
      RVar1 = cu->m_cuDepth[cu_x_1];
      if (RVar1 == '\0') {
        cu->m_cuSize[cu_x_1] = ' ';
      }
      else if (RVar1 == '\x01') {
        cu->m_cuSize[cu_x_1] = '\x10';
      }
      else if (RVar1 == '\x02') {
        cu->m_cuSize[cu_x_1] = '\b';
      }
    }
  }
  return;
}

Assistant:

static void proc_ctu32(H265eSlice *slice, DataCu *cu)
{
    H265eSps *sps = slice->m_sps;
    RK_U32 k, m;
    RK_U32 cu_x_1, cu_y_1;
    RK_U32 m_nCtuSize = sps->m_maxCUSize;
    RK_U32 lpelx = cu->pixelX;
    RK_U32 rpelx = lpelx + m_nCtuSize - 1;
    RK_U32 tpely = cu->pixelY;
    RK_U32 bpely = tpely + m_nCtuSize - 1;
    RK_U32 numPartions = 1 << (sps->m_maxCUDepth << 1);
    RK_S32 cuDepth = 0;

    for (k = 0; k < numPartions; k++) {
        cu->m_cuDepth[k] = 0;
        cu->m_cuSize[k] = m_nCtuSize;
    }
    if ((rpelx <= cu->tile_end_x) && (bpely <= cu->tile_end_y))
        return;

    for (m = 0; m < 4; m ++) {
        cu_x_1 = (m & 1) * (m_nCtuSize >> 1);
        cu_y_1 = (m >> 1) * (m_nCtuSize >> 1);
        proc_cu16(cu, cu_x_1, cu_y_1, numPartions / 4, cuDepth + 1, m);
    }

    for (k = 0; k < numPartions; k++) {
        switch (cu->m_cuDepth[k]) {
        case 0: cu->m_cuSize[k] = 32; break;
        case 1: cu->m_cuSize[k] = 16; break;
        case 2: cu->m_cuSize[k] = 8;  break;
        }
    }
}